

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu.c
# Opt level: O1

void GPU_AddWindowMapping(GPU_Target *target)

{
  uint uVar1;
  GPU_WindowMapping *pGVar2;
  GPU_WindowMapping *__dest;
  long lVar3;
  
  if (_gpu_window_mappings == (GPU_WindowMapping *)0x0) {
    _gpu_window_mappings_size = 10;
    _gpu_window_mappings = (GPU_WindowMapping *)SDL_malloc(0xa0);
    _gpu_num_window_mappings = 0;
  }
  if (((target != (GPU_Target *)0x0) && (target->context != (GPU_Context *)0x0)) &&
     (uVar1 = target->context->windowID, uVar1 != 0)) {
    if (0 < (long)_gpu_num_window_mappings) {
      lVar3 = 0;
      do {
        if (*(uint *)((long)&_gpu_window_mappings->windowID + lVar3) == uVar1) {
          if (*(GPU_Target **)((long)&_gpu_window_mappings->target + lVar3) == target) {
            return;
          }
          GPU_PushErrorCode("GPU_AddWindowMapping",GPU_ERROR_DATA_ERROR,
                            "WindowID %u already has a mapping.",(ulong)uVar1);
          return;
        }
        lVar3 = lVar3 + 0x10;
      } while ((long)_gpu_num_window_mappings << 4 != lVar3);
    }
    lVar3 = (long)_gpu_window_mappings_size;
    if (_gpu_window_mappings_size <= _gpu_num_window_mappings) {
      _gpu_window_mappings_size = _gpu_window_mappings_size * 2;
      __dest = (GPU_WindowMapping *)SDL_malloc(lVar3 << 5);
      pGVar2 = _gpu_window_mappings;
      memcpy(__dest,_gpu_window_mappings,(long)_gpu_num_window_mappings << 4);
      SDL_free(pGVar2);
      _gpu_window_mappings = __dest;
    }
    pGVar2 = _gpu_window_mappings;
    lVar3 = (long)_gpu_num_window_mappings;
    _gpu_num_window_mappings = _gpu_num_window_mappings + 1;
    _gpu_window_mappings[lVar3].windowID = uVar1;
    pGVar2[lVar3].target = target;
  }
  return;
}

Assistant:

void GPU_AddWindowMapping(GPU_Target* target)
{
    Uint32 windowID;
    int i;

    if(_gpu_window_mappings == NULL)
        gpu_init_window_mappings();

    if(target == NULL || target->context == NULL)
        return;

    windowID = target->context->windowID;
    if(windowID == 0)  // Invalid window ID
        return;

    // Check for duplicates
    for(i = 0; i < _gpu_num_window_mappings; i++)
    {
        if(_gpu_window_mappings[i].windowID == windowID)
        {
            if(_gpu_window_mappings[i].target != target)
                GPU_PushErrorCode(__func__, GPU_ERROR_DATA_ERROR, "WindowID %u already has a mapping.", windowID);
            return;
        }
        // Don't check the target because it's okay for a single target to be used with multiple windows
    }

    // Check if list is big enough to hold another
    if(_gpu_num_window_mappings >= _gpu_window_mappings_size)
    {
        GPU_WindowMapping* new_array;
        _gpu_window_mappings_size *= 2;
        new_array = (GPU_WindowMapping*)SDL_malloc(_gpu_window_mappings_size * sizeof(GPU_WindowMapping));
        memcpy(new_array, _gpu_window_mappings, _gpu_num_window_mappings * sizeof(GPU_WindowMapping));
        SDL_free(_gpu_window_mappings);
        _gpu_window_mappings = new_array;
    }

    // Add to end of list
    {
        GPU_WindowMapping m;
        m.windowID = windowID;
        m.target = target;
        _gpu_window_mappings[_gpu_num_window_mappings] = m;
    }
    _gpu_num_window_mappings++;
}